

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O0

void __thiscall CfdLogger_Destructor_Test::TestBody(CfdLogger_Destructor_Test *this)

{
  bool bVar1;
  AssertHelper local_78;
  Message local_70 [2];
  undefined1 local_60 [16];
  void *local_50;
  void *local_48;
  undefined1 local_30 [8];
  CfdLogger logger;
  CfdLogger_Destructor_Test *this_local;
  
  logger.function_address_ = this;
  cfd::core::logger::CfdLogger::CfdLogger((CfdLogger *)local_30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::logger::CfdLogger::CfdLogger((CfdLogger *)local_60);
      local_30 = (undefined1  [8])local_60._0_8_;
      logger.is_alive_ = (bool)local_60[8];
      logger._1_3_ = local_60._9_3_;
      logger.log_level_ = local_60._12_4_;
      logger._8_8_ = local_50;
      logger.default_logger_ = local_48;
      cfd::core::logger::CfdLogger::~CfdLogger((CfdLogger *)local_60);
    }
  }
  else {
    testing::Message::Message(local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x28,
               "Expected: (logger = CfdLogger()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  cfd::core::logger::CfdLogger::~CfdLogger((CfdLogger *)local_30);
  return;
}

Assistant:

TEST(CfdLogger, Destructor) {
  CfdLogger logger;
  EXPECT_NO_THROW((logger = CfdLogger()));
}